

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  pointer pbVar1;
  pointer pcVar2;
  bool second_dash;
  Classifer classifer;
  Classifer local_1c;
  
  if (*positional_only != false) {
switchD_00116dbc_caseD_0:
    _parse_positional(this,args);
    return;
  }
  local_1c = _recognize(this,(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + -1);
  switch(local_1c) {
  case NONE:
    goto switchD_00116dbc_caseD_0;
  case POSITIONAL_MARK:
    ::std::
    vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
    ::emplace_back<CLI::detail::Classifer&,std::__cxx11::string&>
              ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                *)&this->missing_,&local_1c,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar2 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar1[-1].field_2) {
      operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
    }
    *positional_only = true;
    return;
  case SHORT:
    second_dash = false;
    break;
  case LONG:
    second_dash = true;
    break;
  case SUBCOMMAND:
    _parse_subcommand(this,args);
    return;
  default:
    return;
  }
  _parse_arg(this,args,second_dash);
  return;
}

Assistant:

void _parse_single(std::vector<std::string> &args, bool &positional_only) {

        detail::Classifer classifer = positional_only ? detail::Classifer::NONE : _recognize(args.back());
        switch(classifer) {
        case detail::Classifer::POSITIONAL_MARK:
            missing_.emplace_back(classifer, args.back());
            args.pop_back();
            positional_only = true;
            break;
        case detail::Classifer::SUBCOMMAND:
            _parse_subcommand(args);
            break;
        case detail::Classifer::LONG:
            // If already parsed a subcommand, don't accept options_
            _parse_arg(args, true);
            break;
        case detail::Classifer::SHORT:
            // If already parsed a subcommand, don't accept options_
            _parse_arg(args, false);
            break;
        case detail::Classifer::NONE:
            // Probably a positional or something for a parent (sub)command
            _parse_positional(args);
        }
    }